

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFNameTreeObjectHelper.cc
# Opt level: O0

void __thiscall
QPDFNameTreeObjectHelper::iterator::iterator(iterator *this,shared_ptr<NNTreeIterator> *i)

{
  shared_ptr<NNTreeIterator> *i_local;
  iterator *this_local;
  
  this->_vptr_iterator = (_func_int **)&PTR__iterator_0058d430;
  std::shared_ptr<NNTreeIterator>::shared_ptr(&this->impl,i);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>
  ::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle,_true>
            (&this->ivalue);
  return;
}

Assistant:

QPDFNameTreeObjectHelper::iterator::iterator(std::shared_ptr<NNTreeIterator> const& i) :
    impl(i)
{
}